

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void upb_Message_DeleteUnknown(upb_Message *msg,char *data,size_t len)

{
  _Bool _Var1;
  char *pcVar2;
  char *full_unknown;
  size_t full_unknown_size;
  char *internal_unknown_end;
  upb_Message_Internal *in;
  size_t len_local;
  char *data_local;
  upb_Message *msg_local;
  
  in = (upb_Message_Internal *)len;
  len_local = (size_t)data;
  data_local = (char *)msg;
  _Var1 = upb_Message_IsFrozen(msg);
  if (_Var1) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/message.c"
                  ,0x43,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
  }
  internal_unknown_end =
       (char *)_upb_Message_GetInternal_dont_copy_me__upb_internal_use_only
                         ((upb_Message *)data_local);
  full_unknown_size =
       (long)&((upb_Message_Internal *)internal_unknown_end)->size +
       (ulong)((upb_Message_Internal *)internal_unknown_end)->unknown_end;
  pcVar2 = upb_Message_GetUnknown((upb_Message *)data_local,(size_t *)&full_unknown);
  if (len_local < pcVar2) {
    __assert_fail("(uintptr_t)data >= (uintptr_t)full_unknown",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/message.c"
                  ,0x4a,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
  }
  if (pcVar2 + (long)full_unknown <= len_local) {
    __assert_fail("(uintptr_t)data < (uintptr_t)(full_unknown + full_unknown_size)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/message.c"
                  ,0x4b,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
  }
  if (len_local < (long)&in->size + len_local) {
    if ((long)&in->size + len_local <= full_unknown_size) {
      if ((long)&in->size + len_local != full_unknown_size) {
        memmove((void *)len_local,(void *)((long)&in->size + len_local),
                (full_unknown_size - len_local) - (long)in);
      }
      *(int *)(internal_unknown_end + 4) = *(int *)(internal_unknown_end + 4) - (int)in;
      return;
    }
    __assert_fail("(uintptr_t)(data + len) <= (uintptr_t)internal_unknown_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/message.c"
                  ,0x4d,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
  }
  __assert_fail("(uintptr_t)(data + len) > (uintptr_t)data",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/message.c"
                ,0x4c,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
}

Assistant:

void upb_Message_DeleteUnknown(upb_Message* msg, const char* data, size_t len) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  const char* internal_unknown_end = UPB_PTR_AT(in, in->unknown_end, char);

#ifndef NDEBUG
  size_t full_unknown_size;
  const char* full_unknown = upb_Message_GetUnknown(msg, &full_unknown_size);
  UPB_ASSERT((uintptr_t)data >= (uintptr_t)full_unknown);
  UPB_ASSERT((uintptr_t)data < (uintptr_t)(full_unknown + full_unknown_size));
  UPB_ASSERT((uintptr_t)(data + len) > (uintptr_t)data);
  UPB_ASSERT((uintptr_t)(data + len) <= (uintptr_t)internal_unknown_end);
#endif

  if ((data + len) != internal_unknown_end) {
    memmove((char*)data, data + len, internal_unknown_end - data - len);
  }
  in->unknown_end -= len;
}